

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadTestFixture.cpp
# Opt level: O1

uint64_t __thiscall
celero::ThreadTestFixture::run
          (ThreadTestFixture *this,uint64_t threads,uint64_t calls,ExperimentValue *experimentValue)

{
  _func_int **pp_Var1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint64_t uVar3;
  uint64_t uVar4;
  
  iVar2 = (*(this->super_TestFixture)._vptr_TestFixture[0xb])();
  pp_Var1 = (this->super_TestFixture)._vptr_TestFixture;
  if (CONCAT44(extraout_var,iVar2) != 0) {
    iVar2 = (*pp_Var1[0xb])(this);
    return CONCAT44(extraout_var_00,iVar2);
  }
  (*pp_Var1[6])(this,experimentValue);
  uVar3 = timer::GetSystemTime();
  (*(this->super_TestFixture)._vptr_TestFixture[4])(this,experimentValue);
  (*(this->super_TestFixture)._vptr_TestFixture[0xc])(this,threads,calls);
  (*(this->super_TestFixture)._vptr_TestFixture[0xd])(this);
  (*(this->super_TestFixture)._vptr_TestFixture[5])(this);
  uVar4 = timer::GetSystemTime();
  (*(this->super_TestFixture)._vptr_TestFixture[7])(this);
  return uVar4 - uVar3;
}

Assistant:

uint64_t ThreadTestFixture::run(uint64_t threads, uint64_t calls, const celero::TestFixture::ExperimentValue* const experimentValue)
{
	if(this->HardCodedMeasurement() == 0)
	{
		// Set up the testing fixture.
		this->setUp(experimentValue);

		// Get the starting time.
		const auto startTime = celero::timer::GetSystemTime();

		this->onExperimentStart(experimentValue);

		// Start working threads.
		this->startThreads(threads, calls);

		// Stop working threads.
		this->stopThreads();

		this->onExperimentEnd();

		const auto endTime = celero::timer::GetSystemTime();

		// Tear down the testing fixture.
		this->tearDown();

		// Return the duration in microseconds for the given problem size.
		return (endTime - startTime);
	}

	return this->HardCodedMeasurement();
}